

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseMacroCall(Parser *this)

{
  _Rb_tree_node_base *__k;
  pointer pCVar1;
  undefined1 uVar2;
  Token *token;
  iterator iVar3;
  Token *pTVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  Parser *in_RSI;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  unsigned_long *in_R9;
  bool bVar9;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> command;
  optional<std::vector<Token,_std::allocator<Token>_>_> tokens;
  set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> identifierParameters;
  TokenStreamTokenizer macroTokenizer;
  undefined1 local_190 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  undefined1 local_118 [8];
  _Rb_tree_node_base local_110;
  pointer local_f0;
  optional<std::vector<Token,_std::allocator<Token>_>_> local_e8;
  Tokenizer local_c8;
  
  token = Tokenizer::peekToken
                    ((in_RSI->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (token->type != Identifier) {
LAB_00147cfa:
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  if (*(__index_type *)
       ((long)&(token->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
LAB_001481cc:
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  iVar3 = std::
          _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
          ::find(&(in_RSI->macros)._M_t,(key_type *)&token->value);
  if ((_Rb_tree_header *)iVar3._M_node == &(in_RSI->macros)._M_t._M_impl.super__Rb_tree_header)
  goto LAB_00147cfa;
  Tokenizer::eatTokens
            ((in_RSI->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  Tokenizer::Tokenizer(&local_c8);
  local_110._M_left = &local_110;
  local_110._M_color = _S_red;
  local_110._M_parent = (_Base_ptr)0x0;
  local_f0 = (pointer)0x0;
  local_190._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_110._M_right = local_110._M_left;
  if (iVar3._M_node[3]._M_parent != *(_Base_ptr *)(iVar3._M_node + 3)) {
    do {
      pTVar4 = Tokenizer::peekToken
                         ((in_RSI->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
      if (pTVar4->type == Separator) {
        local_170._0_8_ = (long)iVar3._M_node[3]._M_parent - *(long *)(iVar3._M_node + 3) >> 5;
        printError<unsigned_long,unsigned_long>
                  (in_RSI,token,"Too few macro arguments (%d vs %d)",(unsigned_long *)local_190,
                   (unsigned_long *)local_170);
        goto LAB_00147dce;
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_190._0_8_ !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (pTVar4 = Tokenizer::nextToken
                             ((in_RSI->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
         pTVar4->type != Comma)) {
        printError<>(in_RSI,token,"Macro arguments not comma-separated");
        goto LAB_00147dce;
      }
      extractMacroParameter
                ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_170,in_RSI,token);
      uVar2 = local_160[8];
      if ((bool)local_160[8] == false) {
        (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        if ((local_170._8_8_ - local_170._0_8_ == 0x60) &&
           (*(TokenType *)(local_170._0_8_ + 0x10) == Identifier)) {
          if (*(__index_type *)
               ((long)&(((ValueType *)(local_170._0_8_ + 0x18))->
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>)
                       .
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 0x20) != '\x04') goto LAB_001481cc;
          std::
          _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
          ::_M_insert_unique<Identifier_const&>
                    ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                      *)local_118,(Identifier *)(local_170._0_8_ + 0x18));
        }
        Tokenizer::registerReplacement
                  (&local_c8,(Identifier *)(local_190._0_8_ * 0x20 + *(long *)(iVar3._M_node + 3)),
                   (vector<Token,_std::allocator<Token>_> *)local_170);
      }
      if ((bool)local_160[8] == true) {
        local_160[8] = false;
        std::vector<Token,_std::allocator<Token>_>::~vector
                  ((vector<Token,_std::allocator<Token>_> *)local_170);
      }
      if ((bool)uVar2 == false) goto LAB_00147dd5;
      local_190._0_8_ = local_190._0_8_ + 1;
    } while ((ulong)local_190._0_8_ <
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)iVar3._M_node[3]._M_parent - *(long *)(iVar3._M_node + 3) >> 5));
  }
  pTVar4 = Tokenizer::peekToken
                     ((in_RSI->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar4->type == Comma) {
    local_170._0_8_ = (long)iVar3._M_node[3]._M_parent - *(long *)(iVar3._M_node + 3) >> 5;
    while (pTVar4 = Tokenizer::peekToken
                              ((in_RSI->entries).
                               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0),
          pTVar4->type == Comma) {
      Tokenizer::eatTokens
                ((in_RSI->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
      extractMacroParameter(&local_e8,in_RSI,token);
      if (local_e8.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged ==
          true) {
        local_e8.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
        _M_payload.
        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
        super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = false
        ;
        std::vector<Token,_std::allocator<Token>_>::~vector
                  ((vector<Token,_std::allocator<Token>_> *)&local_e8);
      }
      local_170._0_8_ = (long)(Tokenizer **)local_170._0_8_ + 1;
    }
    local_190._0_8_ = (long)iVar3._M_node[3]._M_parent - *(long *)(iVar3._M_node + 3) >> 5;
    printError<unsigned_long,unsigned_long>
              (in_RSI,token,"Too many macro arguments (%d vs %d)",(unsigned_long *)local_170,
               (unsigned_long *)local_190);
  }
  else {
    pTVar4 = Tokenizer::nextToken
                       ((in_RSI->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (pTVar4->type == Separator) {
      pCVar1 = (in_RSI->conditionStack).
               super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((pCVar1[-1].inUnknownBlock == false) && (pCVar1[-1].inTrueBlock == false)) {
        std::make_unique<DummyCommand>();
      }
      else {
        if (in_RSI->initializingMacro != true) {
          if (*(long *)(iVar3._M_node + 6) == 0) {
            in_RSI->initializingMacro = true;
            TokenStreamTokenizer::init
                      ((TokenStreamTokenizer *)&local_c8,(EVP_PKEY_CTX *)&iVar3._M_node[5]._M_parent
                      );
            Logger::suppressLevel = Logger::suppressLevel + 1;
            ghc::filesystem::path::path((path *)local_170);
            parse((Parser *)local_190,(Tokenizer *)in_RSI,SUB81(&local_c8,0),(path *)0x1);
            ghc::filesystem::path::~path((path *)local_170);
            if (Logger::suppressLevel != 0) {
              Logger::suppressLevel = Logger::suppressLevel + -1;
            }
            std::
            _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
            ::operator=((_Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                         *)&iVar3._M_node[3]._M_right,&(in_RSI->macroLabels)._M_t);
            std::
            _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
            ::clear(&(in_RSI->macroLabels)._M_t);
            in_RSI->initializingMacro = false;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_190._0_8_ + 8))();
            }
          }
          local_160._16_8_ = iVar3._M_node + 6;
          p_Var6 = iVar3._M_node[4]._M_left;
          local_120._M_p = (pointer)(iVar3._M_node + 4);
          if (p_Var6 != (_Base_ptr)local_120._M_p) {
            local_148._0_8_ = iVar3._M_node + 2;
            do {
              __k = p_Var6 + 1;
              iVar5 = std::
                      _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                      ::find((_Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                              *)local_118,(key_type *)__k);
              if (iVar5._M_node == &local_110) {
                local_170._0_8_ = local_160;
                local_170._8_8_ = (pointer)0x0;
                local_160[0] = '\0';
                local_190._0_8_ = local_190 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_190,*(long *)(p_Var6 + 1),
                           (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
                if (((ulong)local_190._8_8_ < (pointer)0x2) || (*(char *)local_190._0_8_ != '@')) {
                  bVar9 = false;
                }
                else {
                  bVar9 = *(char *)(local_190._0_8_ + 1) == '@';
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_190 + 0x10)) {
                  operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                }
                if (bVar9) {
                  std::__cxx11::string::substr((ulong)(local_148 + 8),(ulong)__k);
                  tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                            ((string *)local_190,(tinyformat *)"@@%s_%s_%08X",
                             (char *)local_148._0_8_,(Identifier *)(local_148 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160._16_8_,in_R9);
LAB_00148086:
                  std::__cxx11::string::operator=((string *)local_170,(string *)local_190);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_190 + 0x10)) {
                    operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                  }
                  uVar7 = local_130._M_allocated_capacity;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_148._8_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._8_8_ != &local_130) {
LAB_00148107:
                    operator_delete(paVar8,(ulong)((long)&((_Base_ptr)uVar7)->_M_color + 1));
                  }
                }
                else {
                  local_190._0_8_ = local_190 + 0x10;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_190,*(long *)(p_Var6 + 1),
                             (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
                  if ((pointer)local_190._8_8_ == (pointer)0x0) {
                    bVar9 = false;
                  }
                  else {
                    bVar9 = *(char *)local_190._0_8_ == '@';
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_190 + 0x10)) {
                    operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                  }
                  if (bVar9) {
                    std::__cxx11::string::substr((ulong)(local_148 + 8),(ulong)__k);
                    tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                              ((string *)local_190,(tinyformat *)0x18b062,(char *)local_148._0_8_,
                               (Identifier *)(local_148 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_160._16_8_,in_R9);
                    goto LAB_00148086;
                  }
                  tinyformat::format<Identifier,Identifier,unsigned_long>
                            ((string *)local_190,(tinyformat *)0x18b063,(char *)local_148._0_8_,
                             (Identifier *)__k,(Identifier *)local_160._16_8_,in_R9);
                  std::__cxx11::string::operator=((string *)local_170,(string *)local_190);
                  uVar7 = local_190._16_8_;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_190._0_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_190 + 0x10)) goto LAB_00148107;
                }
                Tokenizer::registerReplacement(&local_c8,(Identifier *)__k,(string *)local_170);
                if ((pointer)local_170._0_8_ != (pointer)local_160) {
                  operator_delete((void *)local_170._0_8_,CONCAT71(local_160._1_7_,local_160[0]) + 1
                                 );
                }
              }
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            } while (p_Var6 != (_Base_ptr)local_120._M_p);
          }
          TokenStreamTokenizer::init
                    ((TokenStreamTokenizer *)&local_c8,(EVP_PKEY_CTX *)&iVar3._M_node[5]._M_parent);
          *(long *)local_160._16_8_ = *(long *)local_160._16_8_ + 1;
          ghc::filesystem::path::path((path *)local_170);
          parse(this,(Tokenizer *)in_RSI,SUB81(&local_c8,0),(path *)0x1);
          ghc::filesystem::path::~path((path *)local_170);
          goto LAB_00147dd5;
        }
        std::make_unique<DummyCommand>();
      }
      uVar7 = local_170._0_8_;
      local_170._0_8_ = (pointer)0x0;
      (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)uVar7;
      goto LAB_00147dd5;
    }
    printError<>(in_RSI,token,"Macro call not terminated");
  }
LAB_00147dce:
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00147dd5:
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree((_Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
               *)local_118);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::~vector
            (&local_c8.replacements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.invalidToken.originalText._M_dataplus._M_p !=
      &local_c8.invalidToken.originalText.field_2) {
    operator_delete(local_c8.invalidToken.originalText._M_dataplus._M_p,
                    local_c8.invalidToken.originalText.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
  ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                     *)&local_c8.invalidToken.value);
  std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
            ((_List_base<Token,_std::allocator<Token>_> *)&local_c8);
  return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseMacroCall()
{
	const Token& start = peekToken();
	if (start.type != TokenType::Identifier)
		return nullptr;

	auto it = macros.find(start.identifierValue());
	if (it == macros.end())
		return nullptr;

	ParserMacro& macro = it->second;
	eatToken();

	// create a token stream for the macro content,
	// registering replacements for parameter values
	TokenStreamTokenizer macroTokenizer;

	std::set<Identifier> identifierParameters;
	for (size_t i = 0; i < macro.parameters.size(); i++)
	{
		if (peekToken().type == TokenType::Separator)
		{
			printError(start, "Too few macro arguments (%d vs %d)",i,macro.parameters.size());
			return nullptr;
		}

		if (i != 0)
		{
			if (nextToken().type != TokenType::Comma)
			{
				printError(start, "Macro arguments not comma-separated");
				return nullptr;
			}
		}

		auto tokens = extractMacroParameter(start);
		if (!tokens)
			return nullptr;

		// remember any single identifier parameters for the label replacement
		if (tokens->size() == 1 && tokens->front().type == TokenType::Identifier)
			identifierParameters.insert(tokens->front().identifierValue());

		// give them as a replacement to new tokenizer
		macroTokenizer.registerReplacement(macro.parameters[i], *tokens);
	}

	if (peekToken().type == TokenType::Comma)
	{
		size_t count = macro.parameters.size();
		while (peekToken().type == TokenType::Comma)
		{
			// skip comma
			eatToken();

			// skip parameter value
			extractMacroParameter(start);
			++count;
		}

		printError(start, "Too many macro arguments (%d vs %d)",count,macro.parameters.size());
		return nullptr;
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(start, "Macro call not terminated");
		return nullptr;
	}

	// skip macro instantiation in known false blocks
	if (!isInsideUnknownBlock() && !isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	// a macro is fully parsed once when it's loaded
	// to gather all labels. it's not necessary to
	// instantiate other macros at that time
	if (initializingMacro)
		return std::make_unique<DummyCommand>();

	// the first time a macro is instantiated, it needs to be analyzed
	// for labels
	if (macro.counter == 0)
	{
		initializingMacro = true;
		
		// parse the short lived next command
		macroTokenizer.init(macro.content);
		Logger::suppressErrors();
		std::unique_ptr<CAssemblerCommand> command =  parse(&macroTokenizer,true);
		Logger::unsuppressErrors();

		macro.labels = macroLabels;
		macroLabels.clear();
		
		initializingMacro = false;
	}

	// register labels and replacements
	for (const Identifier& label: macro.labels)
	{
		// check if the label is using the name of a parameter
		// in that case, don't register a unique replacement
		if (identifierParameters.find(label) != identifierParameters.end())
			continue;

		// otherwise make sure the name is unique
		std::string fullName;
		if (Global.symbolTable.isLocalSymbol(Identifier(label)))
			fullName = tfm::format("@@%s_%s_%08X",macro.name,label.string().substr(2),macro.counter);
		else if (Global.symbolTable.isStaticSymbol(Identifier(label)))
			fullName = tfm::format("@%s_%s_%08X",macro.name,label.string().substr(1),macro.counter);
		else
			fullName = tfm::format("%s_%s_%08X",macro.name,label,macro.counter);

		macroTokenizer.registerReplacement(label,fullName);
	}

	macroTokenizer.init(macro.content);
	macro.counter++;

	return parse(&macroTokenizer,true);

}